

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppAVar6;
  undefined8 uVar7;
  CmdLineParseException *in_RSI;
  long in_RDI;
  ExitException *ee_1;
  ArgException *e;
  ExitException *ee;
  ArgListIterator it;
  bool matched;
  int i;
  int requiredCount;
  int estat;
  bool shouldExit;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffeb0;
  const_iterator in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  CmdLine *in_stack_ffffffffffffff80;
  XorHandler *in_stack_ffffffffffffff88;
  _Self local_60;
  _Self local_58;
  byte local_49;
  uint local_48;
  int local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *in_stack_ffffffffffffffe0;
  int __status;
  uint3 in_stack_ffffffffffffffec;
  uint uVar8;
  
  uVar8 = (uint)in_stack_ffffffffffffffec;
  __status = 0;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(in_stack_fffffffffffffea0);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),(string *)pvVar3);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe98);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffea0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe98);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  local_44 = 0;
  local_48 = 0;
  do {
    uVar4 = (ulong)local_48;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI);
    if (sVar5 <= uVar4) {
      if (local_44 < *(int *)(in_RDI + 0x80)) {
        missingArgsException(in_stack_ffffffffffffff80);
      }
      if (local_44 <= *(int *)(in_RDI + 0x80)) {
        if ((uVar8 & 0x1000000) == 0) {
          return;
        }
        exit(__status);
      }
      uVar7 = __cxa_allocate_exception(0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffed7,
                          CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffed7,
                          CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)));
      CmdLineParseException::CmdLineParseException
                (in_RSI,(string *)CONCAT44(uVar8,__status),in_stack_ffffffffffffffe0);
      __cxa_throw(uVar7,&CmdLineParseException::typeinfo,
                  CmdLineParseException::~CmdLineParseException);
    }
    local_49 = 0;
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                   (in_stack_fffffffffffffe98);
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                     (in_stack_fffffffffffffe98);
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      ppAVar6 = std::_List_iterator<TCLAP::Arg_*>::operator*
                          ((_List_iterator<TCLAP::Arg_*> *)0x13538b);
      uVar2 = (*(*ppAVar6)->_vptr_Arg[3])(*ppAVar6,&local_48,in_RSI);
      in_stack_fffffffffffffee4 = CONCAT13((char)uVar2,(int3)in_stack_fffffffffffffee4);
      if ((uVar2 & 1) != 0) {
        in_stack_fffffffffffffed8 = (char *)(in_RDI + 0x88);
        std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x1353d4);
        in_stack_fffffffffffffee0 =
             XorHandler::check(in_stack_ffffffffffffff88,(Arg *)in_stack_ffffffffffffff80);
        local_44 = in_stack_fffffffffffffee0 + local_44;
        local_49 = 1;
        break;
      }
      std::_List_iterator<TCLAP::Arg_*>::operator++(&local_58,0);
    }
    if ((local_49 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI,(long)(int)local_48);
      in_stack_fffffffffffffed7 =
           _emptyCombined((CmdLine *)in_stack_fffffffffffffeb8._M_current,in_stack_fffffffffffffeb0)
      ;
      if ((bool)in_stack_fffffffffffffed7) {
        local_49 = 1;
      }
    }
    if (((local_49 & 1) == 0) &&
       (in_stack_fffffffffffffed6 = Arg::ignoreRest(), !(bool)in_stack_fffffffffffffed6)) {
      uVar7 = __cxa_allocate_exception(0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffed7,
                          CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI,(long)(int)local_48);
      CmdLineParseException::CmdLineParseException
                (in_RSI,(string *)CONCAT44(uVar8,__status),in_stack_ffffffffffffffe0);
      __cxa_throw(uVar7,&CmdLineParseException::typeinfo,
                  CmdLineParseException::~CmdLineParseException);
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;

	try {
		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() )
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}